

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holding_property.cpp
# Opt level: O2

void __thiscall
HoldingProperty_MoveProp_Test::~HoldingProperty_MoveProp_Test(HoldingProperty_MoveProp_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HoldingProperty, MoveProp)
{
  HoldingMovableType obj;
  auto remembered_value = obj.value1().getId();
  obj.value2 = std::move( obj.value1 );
  EXPECT_EQ( remembered_value, obj.value2().getId() );
  EXPECT_EQ( 0, obj.value1().getId() );
  
  remembered_value = obj.value3().id;
  obj.value2 = std::move( obj.value3 );
  EXPECT_EQ( remembered_value, obj.value2().getId() );
  EXPECT_EQ( 0, obj.value3().id );
  
  remembered_value = obj.ro_value().getId();
  obj.value2 = std::move( obj.ro_value );
  EXPECT_EQ( remembered_value, obj.value2().getId() );
  EXPECT_EQ( 0, obj.ro_value().getId() );
  
  remembered_value = obj.ro_value2().id;
  obj.value2 = std::move( obj.ro_value2 );
  EXPECT_EQ( remembered_value, obj.value2().getId() );
  EXPECT_EQ( 0, obj.ro_value2().id );
  
  HoldingMovableType obj2;
  remembered_value = obj2.value1().getId();
  obj.value2 = std::move( obj2.value1 );
  EXPECT_EQ( remembered_value, obj.value2().getId() );
  EXPECT_EQ( 0, obj2.value1().getId() );
  
  remembered_value = obj2.value3().id;
  obj.value2 = std::move( obj2.value3 );
  EXPECT_EQ( remembered_value, obj.value2().getId() );
  EXPECT_EQ( 0, obj2.value3().id );
  
  remembered_value = obj2.ro_value().getId();
  obj.value2 = std::move( obj2.ro_value );
  EXPECT_EQ( remembered_value, obj.value2().getId() );
  EXPECT_EQ( 0, obj2.ro_value().getId() );
  
  remembered_value = obj2.ro_value2().id;
  obj.value2 = std::move( obj2.ro_value2 );
  EXPECT_EQ( remembered_value, obj.value2().getId() );
  EXPECT_EQ( 0, obj2.ro_value2().id );
}